

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

ForStatement * __thiscall SQCompilation::SQParser::parseForStatement(SQParser *this)

{
  SQInteger SVar1;
  SQParser *this_00;
  ForStatement *pFVar2;
  SQParser *in_RDI;
  SQParser *unaff_retaddr;
  Statement *body;
  bool wrapped;
  Expr *mod;
  Expr *cond;
  Node *init;
  SQInteger c;
  SQInteger l;
  NestingChecker nc;
  SQParser *in_stack_000000e8;
  SQParser *in_stack_ffffffffffffff28;
  SQParser *in_stack_ffffffffffffff30;
  SQParser *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Expr *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  Expr *in_stack_ffffffffffffff78;
  SQParser *in_stack_ffffffffffffff80;
  SQInteger SVar3;
  SQExpressionContext expression_context;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar4;
  SQParser *pSVar5;
  NestingChecker local_18;
  SQExpressionContext expression_context_00;
  
  pSVar5 = in_RDI;
  NestingChecker::NestingChecker
            ((NestingChecker *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  expression_context_00 = (SQExpressionContext)((ulong)pSVar5 >> 0x20);
  line(in_RDI);
  SVar1 = column(in_RDI);
  SVar3 = SVar1;
  Consume(in_stack_ffffffffffffff30,(SQInteger)in_stack_ffffffffffffff28);
  expression_context = (SQExpressionContext)((ulong)SVar3 >> 0x20);
  Expect(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  if (in_RDI->_token == 0x11b) {
    in_stack_ffffffffffffff80 = (SQParser *)parseLocalDeclStatement(in_stack_000000e8);
  }
  else if (in_RDI->_token != 0x3b) {
    in_stack_ffffffffffffff78 = parseCommaExpr(in_RDI,expression_context);
  }
  Expect(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  if (in_RDI->_token != 0x3b) {
    Expression(unaff_retaddr,expression_context_00);
  }
  Expect(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  pSVar5 = (SQParser *)0x0;
  if (in_RDI->_token != 0x29) {
    pSVar5 = (SQParser *)parseCommaExpr(in_RDI,expression_context);
  }
  Expect(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  uVar4 = 0;
  checkBraceIndentationStyle(in_stack_ffffffffffffff30);
  this_00 = (SQParser *)IfLikeBlock(pSVar5,(bool *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
  pSVar5 = this_00;
  uVar4 = IsEndOfStatement(in_RDI);
  if (!(bool)uVar4) {
    reportDiagnostic(in_RDI,0x38,"for loop body");
  }
  if ((in_RDI->_token != 0) && (in_RDI->_token != 0x7d)) {
    in_stack_ffffffffffffff50 = (Expr *)line(in_RDI);
    in_stack_ffffffffffffff4c = Node::lineEnd((Node *)this_00);
    if ((in_stack_ffffffffffffff50 != (Expr *)(long)in_stack_ffffffffffffff4c) &&
       (in_stack_ffffffffffffff40 = (SQParser *)column(in_RDI),
       SVar1 < (long)in_stack_ffffffffffffff40)) {
      reportDiagnostic(in_RDI,0x68);
    }
  }
  pFVar2 = newNode<SQCompilation::ForStatement,SQCompilation::Node*,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Statement*>
                     (pSVar5,(Node *)CONCAT17(uVar4,in_stack_ffffffffffffff58),
                      in_stack_ffffffffffffff50,
                      (Expr *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      (Statement *)in_stack_ffffffffffffff40);
  pFVar2 = setCoordinates<SQCompilation::ForStatement>
                     (in_stack_ffffffffffffff40,pFVar2,(SQInteger)in_stack_ffffffffffffff30,
                      (SQInteger)in_stack_ffffffffffffff28);
  NestingChecker::~NestingChecker(&local_18);
  return pFVar2;
}

Assistant:

ForStatement* SQParser::parseForStatement()
{
    NestingChecker nc(this);

    SQInteger l = line(), c = column();

    Consume(TK_FOR);

    Expect(_SC('('));

    Node *init = NULL;
    if (_token == TK_LOCAL)
        init = parseLocalDeclStatement();
    else if (_token != _SC(';')) {
        init = parseCommaExpr(SQE_REGULAR);
    }
    Expect(_SC(';'));

    Expr *cond = NULL;
    if(_token != _SC(';')) {
        cond = Expression(SQE_LOOP_CONDITION);
    }
    Expect(_SC(';'));

    Expr *mod = NULL;
    if(_token != _SC(')')) {
        mod = parseCommaExpr(SQE_REGULAR);
    }
    Expect(_SC(')'));

    bool wrapped = false;
    checkBraceIndentationStyle();
    Statement *body = IfLikeBlock(wrapped);

    if (!IsEndOfStatement()) {
      reportDiagnostic(DiagnosticsId::DI_STMT_SAME_LINE, "for loop body");
    }

    if (_token != SQUIRREL_EOB && _token != _SC('}')) {
      if (line() != body->lineEnd() && column() > c) {
        reportDiagnostic(DiagnosticsId::DI_SUSPICIOUS_FMT);
      }
    }

    return setCoordinates(newNode<ForStatement>(init, cond, mod, body), l, c);
}